

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
at<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,int index)

{
  LogMessage *pLVar1;
  LogMessage local_a0;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (index < 0) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x6a5);
    pLVar1 = LogMessage::operator<<(&local_a0,"CHECK failed: (index) >= (0): ");
    LogFinisher::operator=((LogFinisher *)&local_68,pLVar1);
    LogMessage::~LogMessage(&local_a0);
  }
  if (this->current_size_ <= index) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x6a6);
    pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: (index) < (current_size_): ");
    LogFinisher::operator=(&local_29,pLVar1);
    LogMessage::~LogMessage(&local_68);
  }
  return (Type *)this->rep_->elements[index];
}

Assistant:

inline const typename TypeHandler::Type& RepeatedPtrFieldBase::at(
    int index) const {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return *cast<TypeHandler>(rep_->elements[index]);
}